

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.cpp
# Opt level: O2

void test_qclab_dense_SquareMatrix<double>(void)

{
  bool bVar1;
  _Head_base<0UL,_double_*,_false> _Var2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  _Head_base<0UL,_double_*,_false> _Var8;
  AssertionResult gtest_ar;
  SquareMatrix<double> M4copy;
  SquareMatrix<double> M1copy;
  SquareMatrix<double> M4;
  SquareMatrix<double> A;
  SquareMatrix<double> M5;
  SquareMatrix<double> B;
  SquareMatrix<double> M3;
  SquareMatrix<double> M2copy;
  SquareMatrix<double> M2;
  SquareMatrix<double> prod;
  SquareMatrix<double> minus;
  SquareMatrix<double> sum;
  SquareMatrix<double> C;
  SquareMatrix<double> prodAB_check;
  SquareMatrix<double> minusAB_check;
  SquareMatrix<double> Z;
  SquareMatrix<double> prodABCD;
  SquareMatrix<double> prodABC_check;
  SquareMatrix<double> minusABCD;
  SquareMatrix<double> minusABC_check;
  SquareMatrix<double> sumABCD;
  SquareMatrix<double> Z_check;
  SquareMatrix<double> I;
  SquareMatrix<double> prodABCD_check;
  SquareMatrix<double> minusABCD_check;
  SquareMatrix<double> prodABC;
  SquareMatrix<double> minusABC;
  SquareMatrix<double> sumABC;
  SquareMatrix<double> M1;
  SquareMatrix<double> D;
  AssertHelper local_1e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  SquareMatrix<double> I_check;
  AssertionResult gtest_ar__36;
  SquareMatrix<double> prodAB;
  SquareMatrix<double> minusAB;
  SquareMatrix<double> sumAB;
  SquareMatrix<double> sumABCD_check;
  SquareMatrix<double> sumABC_check;
  SquareMatrix<double> sumAB_check;
  SquareMatrix<double> local_150;
  SquareMatrix<double> local_140;
  SquareMatrix<double> local_130;
  SquareMatrix<double> local_120;
  SquareMatrix<double> local_110;
  SquareMatrix<double> local_100;
  SquareMatrix<double> local_f0;
  SquareMatrix<double> local_e0;
  SquareMatrix<double> local_d0;
  SquareMatrix<double> local_c0;
  SquareMatrix<double> local_b0;
  SquareMatrix<double> local_a0;
  SquareMatrix<double> local_90;
  SquareMatrix<double> local_80;
  SquareMatrix<double> local_70;
  SquareMatrix<double> local_60;
  SquareMatrix<double> local_50;
  SquareMatrix<double> local_40;
  
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M1,3);
  M2.size_ = M1.size_;
  M3.size_ = CONCAT44(M3.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1.size()","3",&M2.size_,(int *)&M3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M3,(Message *)&M2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3);
    if (M2.size_ != 0) {
      (**(code **)(*(long *)M2.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2.size_ = M1.size_;
  M3.size_ = CONCAT44(M3.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1.rows()","3",&M2.size_,(int *)&M3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,10,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M3,(Message *)&M2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3);
    if (M2.size_ != 0) {
      (**(code **)(*(long *)M2.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2.size_ = M1.size_;
  M3.size_ = CONCAT44(M3.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1.cols()","3",&M2.size_,(int *)&M3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M3,(Message *)&M2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3);
    if (M2.size_ != 0) {
      (**(code **)(*(long *)M2.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2.size_ = M1.size_;
  M3.size_ = CONCAT44(M3.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>((internal *)&gtest_ar,"M1.ld()","3",&M2.size_,(int *)&M3)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M3,(Message *)&M2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3);
    if (M2.size_ != 0) {
      (**(code **)(*(long *)M2.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar4 = 0;
  _Var2._M_head_impl = (double *)M1.data_;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    _Var8._M_head_impl = _Var2._M_head_impl;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      *_Var8._M_head_impl = (double)(iVar4 + (int)lVar5) + 0.5;
      _Var8._M_head_impl = _Var8._M_head_impl + M1.size_ * 8;
    }
    _Var2._M_head_impl = _Var2._M_head_impl + 1;
    iVar4 = iVar4 + 3;
  }
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      M2.size_ = (size_type_conflict)((double)(iVar4 + (int)lVar5) + 0.5);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"M1(i,j)","T(c + 0.5)",
                 (double *)
                 (M1.size_ * lVar5 * 8 +
                  (long)M1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                        _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3 * 8),
                 (double *)&M2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&M2);
        pcVar6 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x18,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M3,(Message *)&M2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3);
        if (M2.size_ != 0) {
          (**(code **)(*(long *)M2.size_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
    iVar4 = iVar4 + 3;
  }
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M2,3,3.14);
  M3.size_ = M2.size_;
  M4.size_ = CONCAT44(M4.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2.size()","3",&M3.size_,(int *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4,(Message *)&M3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4);
    if (M3.size_ != 0) {
      (**(code **)(*(long *)M3.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M3.size_ = M2.size_;
  M4.size_ = CONCAT44(M4.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2.rows()","3",&M3.size_,(int *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4,(Message *)&M3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4);
    if (M3.size_ != 0) {
      (**(code **)(*(long *)M3.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M3.size_ = M2.size_;
  M4.size_ = CONCAT44(M4.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2.cols()","3",&M3.size_,(int *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x20,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4,(Message *)&M3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4);
    if (M3.size_ != 0) {
      (**(code **)(*(long *)M3.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M3.size_ = M2.size_;
  M4.size_ = CONCAT44(M4.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>((internal *)&gtest_ar,"M2.ld()","3",&M3.size_,(int *)&M4)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x21,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4,(Message *)&M3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4);
    if (M3.size_ != 0) {
      (**(code **)(*(long *)M3.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      M3.size_ = (size_type_conflict)&DAT_40091eb851eb851f;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"M2(i,j)","T(3.14)",
                 (double *)
                 (M2.size_ * lVar5 * 8 +
                  (long)M2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                        _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3 * 8),
                 (double *)&M3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&M3);
        pcVar6 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x25,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M4,(Message *)&M3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4);
        if (M3.size_ != 0) {
          (**(code **)(*(long *)M3.size_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
  }
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M3,1.0,2.0,3.0,4.0);
  M4.size_ = M3.size_;
  M4copy.size_ = CONCAT44(M4copy.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M3.size()","2",&M4.size_,(int *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = M3.size_;
  M4copy.size_ = CONCAT44(M4copy.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M3.rows()","2",&M4.size_,(int *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = M3.size_;
  M4copy.size_ = CONCAT44(M4copy.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M3.cols()","2",&M4.size_,(int *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = M3.size_;
  M4copy.size_ = CONCAT44(M4copy.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M3.ld()","2",&M4.size_,(int *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = 0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M3(0,0)","T(1.0)",
             (double *)
             M3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,(double *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x30,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = (size_type_conflict)&DAT_4008000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M3(1,0)","T(3.0)",
             (double *)
             ((long)M3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 8),(double *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x31,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = 0x4000000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M3(0,1)","T(2.0)",
             (double *)
             (M3.size_ * 8 +
             (long)M3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),(double *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x32,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4.size_ = (size_type_conflict)&DAT_4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M3(1,1)","T(4.0)",
             (double *)
             ((long)M3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M3.size_ * 8 + 8),
             (double *)&M4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x33,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy,(Message *)&M4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy);
    if (M4.size_ != 0) {
      (**(code **)(*(long *)M4.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar6 = &DAT_402c000000000000;
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&M4,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0);
  M4copy.size_ = M4.size_;
  M1copy.size_ = CONCAT44(M1copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4.size()","4",&M4copy.size_,(int *)&M1copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x39,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = M4.size_;
  M1copy.size_ = CONCAT44(M1copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4.rows()","4",&M4copy.size_,(int *)&M1copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = M4.size_;
  M1copy.size_ = CONCAT44(M1copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4.cols()","4",&M4copy.size_,(int *)&M1copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = M4.size_;
  M1copy.size_ = CONCAT44(M1copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4.ld()","4",&M4copy.size_,(int *)&M1copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = 0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(0,0)","T( 1.0)",
             (double *)
             M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4014000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(1,0)","T( 5.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 8),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x40,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4022000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(2,0)","T( 9.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x41,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_402a000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(3,0)","T(13.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x42,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = 0x4000000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(0,1)","T( 2.0)",
             (double *)
             (M4.size_ * 8 +
             (long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4018000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(1,1)","T( 6.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 8 + 8),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x45,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4024000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(2,1)","T(10.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 8 + 0x10),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x46,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_402c000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(3,1)","T(14.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 8 + 0x18),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x47,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4008000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(0,2)","T( 3.0)",
             (double *)
             (M4.size_ * 0x10 +
             (long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x49,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_401c000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(1,2)","T( 7.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 0x10 + 8),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4026000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(2,2)","T(11.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 0x10 + 0x10),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_402e000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(3,2)","T(15.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 0x10 + 0x18),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(0,3)","T( 4.0)",
             (double *)
             (M4.size_ * 0x18 +
             (long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4020000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(1,3)","T( 8.0)",
             (double *)
             (M4.size_ * 0x18 +
              (long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 8),(double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4028000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(2,3)","T(12.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 0x18 + 0x10),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x50,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M4copy.size_ = (size_type_conflict)&DAT_4030000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"M4(3,3)","T(16.0)",
             (double *)
             ((long)M4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                    .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + M4.size_ * 0x18 + 0x18),
             (double *)&M4copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M4copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M1copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x51,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M1copy,(Message *)&M4copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M1copy);
    if (M4copy.size_ != 0) {
      (**(code **)(*(long *)M4copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M4copy,&M4);
  M1copy.size_ = M4copy.size_;
  M2copy.size_ = CONCAT44(M2copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4copy.size()","4",&M1copy.size_,(int *)&M2copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M1copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M2copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x54,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M2copy,(Message *)&M1copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2copy);
    if (M1copy.size_ != 0) {
      (**(code **)(*(long *)M1copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M1copy.size_ = M4copy.size_;
  M2copy.size_ = CONCAT44(M2copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4copy.rows()","4",&M1copy.size_,(int *)&M2copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M1copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M2copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x55,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M2copy,(Message *)&M1copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2copy);
    if (M1copy.size_ != 0) {
      (**(code **)(*(long *)M1copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M1copy.size_ = M4copy.size_;
  M2copy.size_ = CONCAT44(M2copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4copy.cols()","4",&M1copy.size_,(int *)&M2copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M1copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M2copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x56,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M2copy,(Message *)&M1copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2copy);
    if (M1copy.size_ != 0) {
      (**(code **)(*(long *)M1copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M1copy.size_ = M4copy.size_;
  M2copy.size_ = CONCAT44(M2copy.size_._4_4_,4);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M4copy.ld()","4",&M1copy.size_,(int *)&M2copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M1copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M2copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x57,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M2copy,(Message *)&M1copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2copy);
    if (M1copy.size_ != 0) {
      (**(code **)(*(long *)M1copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M4copy,&M4);
  M1copy.size_ = CONCAT71(M1copy.size_._1_7_,bVar1);
  M1copy.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&M2copy);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M1copy,(AssertionResult *)"M4copy == M4","false",
               "true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x58,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&M5,(Message *)&M2copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M5);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (M2copy.size_ != 0) {
      (**(code **)(*(long *)M2copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M1copy.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M1copy);
  qclab::dense::SquareMatrix<double>::operator=(&M1copy,&M1);
  M2copy.size_ = M1copy.size_;
  M5.size_ = CONCAT44(M5.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1copy.size()","3",&M2copy.size_,(int *)&M5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M5,(Message *)&M2copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M5);
    if (M2copy.size_ != 0) {
      (**(code **)(*(long *)M2copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2copy.size_ = M1copy.size_;
  M5.size_ = CONCAT44(M5.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1copy.rows()","3",&M2copy.size_,(int *)&M5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M5,(Message *)&M2copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M5);
    if (M2copy.size_ != 0) {
      (**(code **)(*(long *)M2copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2copy.size_ = M1copy.size_;
  M5.size_ = CONCAT44(M5.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1copy.cols()","3",&M2copy.size_,(int *)&M5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M5,(Message *)&M2copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M5);
    if (M2copy.size_ != 0) {
      (**(code **)(*(long *)M2copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M2copy.size_ = M1copy.size_;
  M5.size_ = CONCAT44(M5.size_._4_4_,3);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M1copy.ld()","3",&M2copy.size_,(int *)&M5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M2copy);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x60,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M5,(Message *)&M2copy);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M5);
    if (M2copy.size_ != 0) {
      (**(code **)(*(long *)M2copy.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M1copy,&M1);
  M2copy.size_ = CONCAT71(M2copy.size_._1_7_,bVar1);
  M2copy.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&M5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M2copy,(AssertionResult *)"M1copy == M1","false",
               "true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x61,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&M5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (M5.size_ != 0) {
      (**(code **)(*(long *)M5.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M2copy.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&M2copy,3);
  qclab::dense::SquareMatrix<double>::operator=(&M2copy,&M2);
  M5.size_ = M2copy.size_;
  A.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2copy.size()","3",&M5.size_,(int *)&A);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x65,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&M5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    if (M5.size_ != 0) {
      (**(code **)(*(long *)M5.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M5.size_ = M2copy.size_;
  A.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2copy.rows()","3",&M5.size_,(int *)&A);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x66,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&M5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    if (M5.size_ != 0) {
      (**(code **)(*(long *)M5.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M5.size_ = M2copy.size_;
  A.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2copy.cols()","3",&M5.size_,(int *)&A);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x67,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&M5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    if (M5.size_ != 0) {
      (**(code **)(*(long *)M5.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  M5.size_ = M2copy.size_;
  A.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"M2copy.ld()","3",&M5.size_,(int *)&A);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&M5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x68,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&M5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    if (M5.size_ != 0) {
      (**(code **)(*(long *)M5.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M2copy,&M2);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M2copy == M2","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M2,&M2);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M2 == M2","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M2,&M2);
  M5.size_ = CONCAT71(M5.size_._1_7_,!bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M2 != M2","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M3,&M3);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M3 == M3","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M3,&M3);
  M5.size_ = CONCAT71(M5.size_._1_7_,!bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M3 != M3","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M4,&M4);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M4 == M4","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M4,&M4);
  M5.size_ = CONCAT71(M5.size_._1_7_,!bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M4 != M4","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M2,&M3);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M2 != M3","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M2,&M3);
  M5.size_ = CONCAT71(M5.size_._1_7_,!bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M2 == M3","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M3,&M4);
  M5.size_ = CONCAT71(M5.size_._1_7_,bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M3 != M4","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M3,&M4);
  M5.size_ = CONCAT71(M5.size_._1_7_,!bVar1);
  M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&A);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&M5,(AssertionResult *)"M3 == M4","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&B,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&B,(Message *)&A);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&B);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(A.size_._4_4_,(undefined4)A.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&M5.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&M5,1.0,2.0,3.0,4.0,5.0,6.0,0.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M4,&M5);
  A.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  A.size_._0_1_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&A,(AssertionResult *)"M4 != M5","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&C,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&C,(Message *)&B);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&C);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&M4,&M5);
  A.size_._0_1_ = !bVar1;
  A.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&A,(AssertionResult *)"M4 == M5","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&C,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&C,(Message *)&B);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&C);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  *(undefined1 **)
   ((long)M5.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 + M5.size_ * 0x10) =
       &DAT_401c000000000000;
  A.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&M4,&M5);
  A.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)A.size_) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&A,(AssertionResult *)"M4 == M5","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&C,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&C,(Message *)&B);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&C);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator!=(&M4,&M5);
  A.size_._0_1_ = !bVar1;
  A.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&A,(AssertionResult *)"M4 != M5","true","false",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&C,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&C,(Message *)&B);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&C);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&A,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&B,5.0,7.0,6.0,8.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&C,9.0,11.0,10.0,12.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&D,13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&sumAB_check,6.0,9.0,9.0,12.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&sumABC_check,15.0,20.0,19.0,24.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&sumABCD_check,28.0,34.0,34.0,40.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_40,&A);
  qclab::dense::operator+((dense *)&sumAB,&local_40,&B);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_40.data_);
  sumABC.size_ = sumAB.size_;
  sumABCD.size_ = CONCAT44(sumABCD.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"sumAB.size()","2",&sumABC.size_,(int *)&sumABCD);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sumABC);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sumABCD,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sumABCD,(Message *)&sumABC);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sumABCD);
    if (sumABC.size_ != 0) {
      (**(code **)(*(long *)sumABC.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&sumAB,&sumAB_check);
  sumABC.size_ = CONCAT71(sumABC.size_._1_7_,bVar1);
  sumABC.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&sumABCD);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&sumABC,(AssertionResult *)"sumAB == sumAB_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sum,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&sum,(Message *)&sumABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sum);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (sumABCD.size_ != 0) {
      (**(code **)(*(long *)sumABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sumABC.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_60,&A);
  qclab::dense::operator+((dense *)&local_50,&local_60,&B);
  qclab::dense::operator+((dense *)&sumABC,&local_50,&C);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_50.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_60.data_);
  sumABCD.size_ = sumABC.size_;
  sum.size_ = CONCAT44(sum.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"sumABC.size()","2",&sumABCD.size_,(int *)&sum);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sumABCD);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sum,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x90,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sum,(Message *)&sumABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sum);
    if (sumABCD.size_ != 0) {
      (**(code **)(*(long *)sumABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&sumABC,&sumABC_check);
  sumABCD.size_ = CONCAT71(sumABCD.size_._1_7_,bVar1);
  sumABCD.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&sum);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&sumABCD,(AssertionResult *)"sumABC == sumABC_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusAB_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x91,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&minusAB_check,(Message *)&sum);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusAB_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (sum.size_ != 0) {
      (**(code **)(*(long *)sum.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sumABCD.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_90,&A);
  qclab::dense::operator+((dense *)&local_80,&local_90,&B);
  qclab::dense::operator+((dense *)&local_70,&local_80,&C);
  qclab::dense::operator+((dense *)&sumABCD,&local_70,&D);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_70.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_80.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_90.data_);
  sum.size_ = sumABCD.size_;
  minusAB_check.size_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"sumABCD.size()","2",&sum.size_,(int *)&minusAB_check);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sum);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusAB_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x94,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&minusAB_check,(Message *)&sum);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusAB_check);
    if (sum.size_ != 0) {
      (**(code **)(*(long *)sum.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&sumABCD,&sumABCD_check);
  sum.size_ = CONCAT71(sum.size_._1_7_,bVar1);
  sum.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&minusAB_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&sum,(AssertionResult *)"sumABCD == sumABCD_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusABC_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x95,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&minusABC_check,(Message *)&minusAB_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusABC_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(minusAB_check.size_._4_4_,(undefined4)minusAB_check.size_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT44(minusAB_check.size_._4_4_,(undefined4)minusAB_check.size_) + 8)
      )();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sum.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&sum,&A);
  qclab::dense::SquareMatrix<double>::operator+=(&sum,&B);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&sum,&sumAB_check);
  minusAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  minusAB_check.size_._0_1_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&minusABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minusAB_check,
               (AssertionResult *)"sum == sumAB_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x98,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&minusABCD_check,(Message *)&minusABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (minusABC_check.size_ != 0) {
      (**(code **)(*(long *)minusABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minusAB_check.data_);
  qclab::dense::SquareMatrix<double>::operator+=(&sum,&C);
  minusAB_check.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&sum,&sumABC_check);
  minusAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)minusAB_check.size_) {
    testing::Message::Message((Message *)&minusABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minusAB_check,
               (AssertionResult *)"sum == sumABC_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x99,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&minusABCD_check,(Message *)&minusABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (minusABC_check.size_ != 0) {
      (**(code **)(*(long *)minusABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minusAB_check.data_);
  qclab::dense::SquareMatrix<double>::operator+=(&sum,&D);
  minusAB_check.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&sum,&sumABCD_check);
  minusAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)minusAB_check.size_) {
    testing::Message::Message((Message *)&minusABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minusAB_check,
               (AssertionResult *)"sum == sumABCD_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x9a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&minusABCD_check,(Message *)&minusABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (minusABC_check.size_ != 0) {
      (**(code **)(*(long *)minusABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minusAB_check.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&minusAB_check,-4.0,-5.0,-3.0,-4.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&minusABC_check,-13.0,-16.0,-13.0,-16.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&minusABCD_check,-26.0,-30.0,-28.0,-32.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_a0,&A);
  qclab::dense::operator-((dense *)&minusAB,&local_a0,&B);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_a0.data_);
  minusABC.size_ = minusAB.size_;
  minusABCD.size_ = CONCAT44(minusABCD.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"minusAB.size()","2",&minusABC.size_,(int *)&minusABCD);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&minusABC);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minusABCD,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&minusABCD,(Message *)&minusABC);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minusABCD);
    if (minusABC.size_ != 0) {
      (**(code **)(*(long *)minusABC.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&minusAB,&minusAB_check);
  minusABC.size_ = CONCAT71(minusABC.size_._1_7_,bVar1);
  minusABC.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&minusABCD);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minusABC,
               (AssertionResult *)"minusAB == minusAB_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minus,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&minus,(Message *)&minusABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minus);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (minusABCD.size_ != 0) {
      (**(code **)(*(long *)minusABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minusABC.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_c0,&A);
  qclab::dense::operator-((dense *)&local_b0,&local_c0,&B);
  qclab::dense::operator-((dense *)&minusABC,&local_b0,&C);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_b0.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_c0.data_);
  minusABCD.size_ = minusABC.size_;
  minus.size_ = CONCAT44(minus.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"minusABC.size()","2",&minusABCD.size_,(int *)&minus);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&minusABCD);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minus,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&minus,(Message *)&minusABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minus);
    if (minusABCD.size_ != 0) {
      (**(code **)(*(long *)minusABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&minusABC,&minusABC_check);
  minusABCD.size_ = CONCAT71(minusABCD.size_._1_7_,bVar1);
  minusABCD.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&minus);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minusABCD,
               (AssertionResult *)"minusABC == minusABC_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodAB_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&prodAB_check,(Message *)&minus);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodAB_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (minus.size_ != 0) {
      (**(code **)(*(long *)minus.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minusABCD.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_f0,&A);
  qclab::dense::operator-((dense *)&local_e0,&local_f0,&B);
  qclab::dense::operator-((dense *)&local_d0,&local_e0,&C);
  qclab::dense::operator-((dense *)&minusABCD,&local_d0,&D);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_d0.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_e0.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_f0.data_);
  minus.size_ = minusABCD.size_;
  prodAB_check.size_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"minusABCD.size()","2",&minus.size_,(int *)&prodAB_check);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&minus);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodAB_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xac,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prodAB_check,(Message *)&minus);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodAB_check);
    if (minus.size_ != 0) {
      (**(code **)(*(long *)minus.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&minusABCD,&minusABCD_check);
  minus.size_ = CONCAT71(minus.size_._1_7_,bVar1);
  minus.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&prodAB_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&minus,
               (AssertionResult *)"minusABCD == minusABCD_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodABC_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xad,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&prodABC_check,(Message *)&prodAB_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodABC_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(prodAB_check.size_._4_4_,(undefined4)prodAB_check.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(prodAB_check.size_._4_4_,(undefined4)prodAB_check.size_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&minus.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&minus,&A);
  qclab::dense::SquareMatrix<double>::operator-=(&minus,&B);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&minus,&minusAB_check);
  prodAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  prodAB_check.size_._0_1_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&prodABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prodAB_check,
               (AssertionResult *)"minus == minusAB_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&prodABCD_check,(Message *)&prodABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (prodABC_check.size_ != 0) {
      (**(code **)(*(long *)prodABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prodAB_check.data_);
  qclab::dense::SquareMatrix<double>::operator-=(&minus,&C);
  prodAB_check.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&minus,&minusABC_check);
  prodAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)prodAB_check.size_) {
    testing::Message::Message((Message *)&prodABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prodAB_check,
               (AssertionResult *)"minus == minusABC_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&prodABCD_check,(Message *)&prodABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (prodABC_check.size_ != 0) {
      (**(code **)(*(long *)prodABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prodAB_check.data_);
  qclab::dense::SquareMatrix<double>::operator-=(&minus,&D);
  prodAB_check.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&minus,&minusABCD_check)
  ;
  prodAB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)prodAB_check.size_) {
    testing::Message::Message((Message *)&prodABC_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prodAB_check,
               (AssertionResult *)"minus == minusABCD_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodABCD_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&prodABCD_check,(Message *)&prodABC_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodABCD_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (prodABC_check.size_ != 0) {
      (**(code **)(*(long *)prodABC_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prodAB_check.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&prodAB_check,17.0,23.0,39.0,53.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&prodABC_check,383.0,463.0,881.0,1065.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&prodABCD_check,11924.0,12770.0,27428.0,29374.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_100,&A);
  qclab::dense::operator*((dense *)&prodAB,&local_100,&B);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_100.data_);
  prodABC.size_ = prodAB.size_;
  prodABCD.size_ = CONCAT44(prodABCD.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"prodAB.size()","2",&prodABC.size_,(int *)&prodABCD);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&prodABC);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prodABCD,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prodABCD,(Message *)&prodABC);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prodABCD);
    if (prodABC.size_ != 0) {
      (**(code **)(*(long *)prodABC.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&prodAB,&prodAB_check);
  prodABC.size_ = CONCAT71(prodABC.size_._1_7_,bVar1);
  prodABC.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&prodABCD);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prodABC,(AssertionResult *)"prodAB == prodAB_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prod,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&prod,(Message *)&prodABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prod);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (prodABCD.size_ != 0) {
      (**(code **)(*(long *)prodABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prodABC.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_120,&A);
  qclab::dense::operator*((dense *)&local_110,&local_120,&B);
  qclab::dense::operator*((dense *)&prodABC,&local_110,&C);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_110.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_120.data_);
  prodABCD.size_ = prodABC.size_;
  prod.size_ = CONCAT44(prod.size_._4_4_,2);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"prodABC.size()","2",&prodABCD.size_,(int *)&prod);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&prodABCD);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prod,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prod,(Message *)&prodABCD);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prod);
    if (prodABCD.size_ != 0) {
      (**(code **)(*(long *)prodABCD.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&prodABC,&prodABC_check);
  prodABCD.size_ = CONCAT71(prodABCD.size_._1_7_,bVar1);
  prodABCD.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&prod);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prodABCD,
               (AssertionResult *)"prodABC == prodABC_check","false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&Z,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&Z,(Message *)&prod);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&Z);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (prod.size_ != 0) {
      (**(code **)(*(long *)prod.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prodABCD.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&local_150,&A);
  qclab::dense::operator*((dense *)&local_140,&local_150,&B);
  qclab::dense::operator*((dense *)&local_130,&local_140,&C);
  qclab::dense::operator*((dense *)&prodABCD,&local_130,&D);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_130.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_140.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_150.data_);
  prod.size_ = prodABCD.size_;
  Z.size_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"prodABCD.size()","2",&prod.size_,(int *)&Z);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&prod);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&Z,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&Z,(Message *)&prod);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&Z);
    if (prod.size_ != 0) {
      (**(code **)(*(long *)prod.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&prodABCD,&prodABCD_check);
  prod.size_ = CONCAT71(prod.size_._1_7_,bVar1);
  prod.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&Z);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prod,(AssertionResult *)"prodABCD == prodABCD_check"
               ,"false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&Z_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&Z_check,(Message *)&Z);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&Z_check);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(Z.size_._4_4_,(undefined4)Z.size_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(Z.size_._4_4_,(undefined4)Z.size_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&prod.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&prod,&A);
  qclab::dense::SquareMatrix<double>::operator*=(&prod,&B);
  bVar1 = qclab::dense::SquareMatrix<double>::operator==(&prod,&prodAB_check);
  Z.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  Z.size_._0_1_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&Z_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&Z,(AssertionResult *)"prod == prodAB_check","false",
               "true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&I,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,200,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&I,(Message *)&Z_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&I);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (Z_check.size_ != 0) {
      (**(code **)(*(long *)Z_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&Z.data_);
  qclab::dense::SquareMatrix<double>::operator*=(&prod,&C);
  Z.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&prod,&prodABC_check);
  Z.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)Z.size_) {
    testing::Message::Message((Message *)&Z_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&Z,(AssertionResult *)"prod == prodABC_check","false"
               ,"true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&I,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&I,(Message *)&Z_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&I);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (Z_check.size_ != 0) {
      (**(code **)(*(long *)Z_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&Z.data_);
  qclab::dense::SquareMatrix<double>::operator*=(&prod,&D);
  Z.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&prod,&prodABCD_check);
  Z.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)Z.size_) {
    testing::Message::Message((Message *)&Z_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&Z,(AssertionResult *)"prod == prodABCD_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&I,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xca,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&I,(Message *)&Z_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&I);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (Z_check.size_ != 0) {
      (**(code **)(*(long *)Z_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&Z.data_);
  qclab::dense::zeros<double>((dense *)&Z,2);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&Z_check,0.0,0.0,0.0,0.0);
  I.size_._0_1_ = qclab::dense::SquareMatrix<double>::operator==(&Z,&Z_check);
  I.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (!(bool)(undefined1)I.size_) {
    testing::Message::Message((Message *)&I_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&I,(AssertionResult *)"Z == Z_check","false","true",
               pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__36,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__36,(Message *)&I_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__36);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (I_check.size_ != 0) {
      (**(code **)(*(long *)I_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&I.data_);
  qclab::dense::eye<double>((dense *)&I,2);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&I_check,1.0,0.0,0.0,1.0);
  gtest_ar__36.success_ = qclab::dense::SquareMatrix<double>::operator==(&I,&I_check);
  gtest_ar__36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__36.success_) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__36,(AssertionResult *)"I == I_check",
               "false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__36.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&I_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&I.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&Z_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&Z.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prod.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodABCD.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodABC.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodAB.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodABCD_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodABC_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&prodAB_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minus.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusABCD.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusABC.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusAB.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusABCD_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusABC_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&minusAB_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sum.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumABCD.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumABC.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumAB.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumABCD_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumABC_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&sumAB_check.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&D.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&C.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&B.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&A.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M5.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M2copy.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M1copy.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M4copy.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M4.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M3.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&M1.data_);
  return;
}

Assistant:

void test_qclab_dense_SquareMatrix() {

  qclab::dense::SquareMatrix< T >  M1( 3 ) ;
  EXPECT_EQ( M1.size() , 3 ) ;
  EXPECT_EQ( M1.rows() , 3 ) ;
  EXPECT_EQ( M1.cols() , 3 ) ;
  EXPECT_EQ( M1.ld() , 3 ) ;

  int c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      M1(i,j) = c + 0.5 ;
      c++ ;
    }
  }
  c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M1(i,j) , T(c + 0.5) ) ;
      c++ ;
    }
  }

  qclab::dense::SquareMatrix< T >  M2( 3 , 3.14 ) ;
  EXPECT_EQ( M2.size() , 3 ) ;
  EXPECT_EQ( M2.rows() , 3 ) ;
  EXPECT_EQ( M2.cols() , 3 ) ;
  EXPECT_EQ( M2.ld() , 3 ) ;

  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M2(i,j) , T(3.14) ) ;
    }
  }

  qclab::dense::SquareMatrix< T >  M3( 1.0 , 2.0 ,
                                       3.0 , 4.0 ) ;
  EXPECT_EQ( M3.size() , 2 ) ;
  EXPECT_EQ( M3.rows() , 2 ) ;
  EXPECT_EQ( M3.cols() , 2 ) ;
  EXPECT_EQ( M3.ld() , 2 ) ;

  EXPECT_EQ( M3(0,0) , T(1.0) ) ;
  EXPECT_EQ( M3(1,0) , T(3.0) ) ;
  EXPECT_EQ( M3(0,1) , T(2.0) ) ;
  EXPECT_EQ( M3(1,1) , T(4.0) ) ;

  qclab::dense::SquareMatrix< T >  M4(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  7.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_EQ( M4.size() , 4 ) ;
  EXPECT_EQ( M4.rows() , 4 ) ;
  EXPECT_EQ( M4.cols() , 4 ) ;
  EXPECT_EQ( M4.ld() , 4 ) ;

  // column 1
  EXPECT_EQ( M4(0,0) , T( 1.0) ) ;
  EXPECT_EQ( M4(1,0) , T( 5.0) ) ;
  EXPECT_EQ( M4(2,0) , T( 9.0) ) ;
  EXPECT_EQ( M4(3,0) , T(13.0) ) ;
  // column 2
  EXPECT_EQ( M4(0,1) , T( 2.0) ) ;
  EXPECT_EQ( M4(1,1) , T( 6.0) ) ;
  EXPECT_EQ( M4(2,1) , T(10.0) ) ;
  EXPECT_EQ( M4(3,1) , T(14.0) ) ;
  // column 3
  EXPECT_EQ( M4(0,2) , T( 3.0) ) ;
  EXPECT_EQ( M4(1,2) , T( 7.0) ) ;
  EXPECT_EQ( M4(2,2) , T(11.0) ) ;
  EXPECT_EQ( M4(3,2) , T(15.0) ) ;
  // column 4
  EXPECT_EQ( M4(0,3) , T( 4.0) ) ;
  EXPECT_EQ( M4(1,3) , T( 8.0) ) ;
  EXPECT_EQ( M4(2,3) , T(12.0) ) ;
  EXPECT_EQ( M4(3,3) , T(16.0) ) ;

  qclab::dense::SquareMatrix< T >  M4copy( M4 ) ;
  EXPECT_EQ( M4copy.size() , 4 ) ;
  EXPECT_EQ( M4copy.rows() , 4 ) ;
  EXPECT_EQ( M4copy.cols() , 4 ) ;
  EXPECT_EQ( M4copy.ld() , 4 ) ;
  EXPECT_TRUE( M4copy == M4 ) ;

  // operator =
  qclab::dense::SquareMatrix< T >  M1copy ;
  M1copy = M1 ;
  EXPECT_EQ( M1copy.size() , 3 ) ;
  EXPECT_EQ( M1copy.rows() , 3 ) ;
  EXPECT_EQ( M1copy.cols() , 3 ) ;
  EXPECT_EQ( M1copy.ld() , 3 ) ;
  EXPECT_TRUE( M1copy == M1 ) ;

  qclab::dense::SquareMatrix< T >  M2copy( 3 ) ;
  M2copy = M2 ;
  EXPECT_EQ( M2copy.size() , 3 ) ;
  EXPECT_EQ( M2copy.rows() , 3 ) ;
  EXPECT_EQ( M2copy.cols() , 3 ) ;
  EXPECT_EQ( M2copy.ld() , 3 ) ;
  EXPECT_TRUE( M2copy == M2 ) ;

  // operators == and !=
  EXPECT_TRUE( M2 == M2 ) ; EXPECT_FALSE( M2 != M2 ) ;
  EXPECT_TRUE( M3 == M3 ) ; EXPECT_FALSE( M3 != M3 ) ;
  EXPECT_TRUE( M4 == M4 ) ; EXPECT_FALSE( M4 != M4 ) ;
  EXPECT_TRUE( M2 != M3 ) ; EXPECT_FALSE( M2 == M3 ) ;
  EXPECT_TRUE( M3 != M4 ) ; EXPECT_FALSE( M3 == M4 ) ;

  qclab::dense::SquareMatrix< T >  M5(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  0.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_TRUE( M4 != M5 ) ; EXPECT_FALSE( M4 == M5 ) ;
  M5(1,2) = 7.0 ;
  EXPECT_TRUE( M4 == M5 ) ; EXPECT_FALSE( M4 != M5 ) ;

  // operators +=, -=, *=, +, - and *
  qclab::dense::SquareMatrix< T >  A( 1 , 2 ,
                                      3 , 4 ) ;
  qclab::dense::SquareMatrix< T >  B( 5 , 7 ,
                                      6 , 8 ) ;
  qclab::dense::SquareMatrix< T >  C(  9 , 11 ,
                                      10 , 12 ) ;
  qclab::dense::SquareMatrix< T >  D( 13 , 14 ,
                                      15 , 16 ) ;

  qclab::dense::SquareMatrix< T >  sumAB_check(  6 ,  9 ,
                                                 9 , 12 ) ;
  qclab::dense::SquareMatrix< T >  sumABC_check( 15 , 20 ,
                                                 19 , 24 ) ;
  qclab::dense::SquareMatrix< T >  sumABCD_check( 28 , 34 ,
                                                  34 , 40 ) ;

  auto sumAB = A + B ;
  EXPECT_EQ( sumAB.size() , 2 ) ;
  EXPECT_TRUE( sumAB == sumAB_check ) ;

  auto sumABC = A + B + C ;
  EXPECT_EQ( sumABC.size() , 2 ) ;
  EXPECT_TRUE( sumABC == sumABC_check ) ;

  auto sumABCD = A + B + C + D ;
  EXPECT_EQ( sumABCD.size() , 2 ) ;
  EXPECT_TRUE( sumABCD == sumABCD_check ) ;

  auto sum = A ;
  sum += B ;  EXPECT_TRUE( sum == sumAB_check ) ;
  sum += C ;  EXPECT_TRUE( sum == sumABC_check ) ;
  sum += D ;  EXPECT_TRUE( sum == sumABCD_check ) ;

  qclab::dense::SquareMatrix< T >  minusAB_check( -4 , -5 ,
                                                  -3 , -4 ) ;
  qclab::dense::SquareMatrix< T >  minusABC_check( -13 , -16 ,
                                                   -13 , -16 ) ;
  qclab::dense::SquareMatrix< T >  minusABCD_check( -26 , -30 ,
                                                    -28 , -32 ) ;

  auto minusAB = A - B ;
  EXPECT_EQ( minusAB.size() , 2 ) ;
  EXPECT_TRUE( minusAB == minusAB_check ) ;

  auto minusABC = A - B - C ;
  EXPECT_EQ( minusABC.size() , 2 ) ;
  EXPECT_TRUE( minusABC == minusABC_check ) ;

  auto minusABCD = A - B - C - D ;
  EXPECT_EQ( minusABCD.size() , 2 ) ;
  EXPECT_TRUE( minusABCD == minusABCD_check ) ;

  auto minus = A ;
  minus -= B ;  EXPECT_TRUE( minus == minusAB_check ) ;
  minus -= C ;  EXPECT_TRUE( minus == minusABC_check ) ;
  minus -= D ;  EXPECT_TRUE( minus == minusABCD_check ) ;

  qclab::dense::SquareMatrix< T >  prodAB_check( 17 , 23 ,
                                                 39 , 53 ) ;
  qclab::dense::SquareMatrix< T >  prodABC_check( 383 ,  463 ,
                                                  881 , 1065 ) ;
  qclab::dense::SquareMatrix< T >  prodABCD_check( 11924 , 12770 ,
                                                   27428 , 29374 ) ;

  auto prodAB = A * B ;
  EXPECT_EQ( prodAB.size() , 2 ) ;
  EXPECT_TRUE( prodAB == prodAB_check ) ;

  auto prodABC = A * B * C ;
  EXPECT_EQ( prodABC.size() , 2 ) ;
  EXPECT_TRUE( prodABC == prodABC_check ) ;

  auto prodABCD = A * B * C * D ;
  EXPECT_EQ( prodABCD.size() , 2 ) ;
  EXPECT_TRUE( prodABCD == prodABCD_check ) ;

  auto prod = A ;
  prod *= B ;  EXPECT_TRUE( prod == prodAB_check ) ;
  prod *= C ;  EXPECT_TRUE( prod == prodABC_check ) ;
  prod *= D ;  EXPECT_TRUE( prod == prodABCD_check ) ;

  // zeros
  auto Z = qclab::dense::zeros< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  Z_check( 0 , 0 ,
                                            0 , 0 ) ;
  EXPECT_TRUE( Z == Z_check ) ;

  // eye
  auto I = qclab::dense::eye< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  I_check( 1 , 0 ,
                                            0 , 1 ) ;
  EXPECT_TRUE( I == I_check ) ;

}